

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

MainFunc __thiscall capnp::compiler::CompilerMain::getEncodeMain(CompilerMain *this)

{
  ProcessContext *context;
  StringPtr extendedDescription;
  StringPtr helpText;
  StringPtr argumentTitle;
  initializer_list<kj::MainBuilder::OptionName> names;
  StringPtr helpText_00;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  StringPtr helpText_01;
  initializer_list<kj::MainBuilder::OptionName> names_01;
  StringPtr briefDescription;
  StringPtr version;
  MainBuilder *pMVar1;
  Type *func;
  Type *func_00;
  Type *func_01;
  Type *func_02;
  Type *func_03;
  Iface *extraout_RDX;
  CompilerMain *in_RSI;
  MainFunc MVar2;
  undefined1 local_222 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:243:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:243:30)>
  local_220;
  Function<kj::MainBuilder::Validity_()> local_210;
  undefined1 local_1fa [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:242:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:242:33)>
  local_1f8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_1e8;
  StringPtr local_1d8;
  undefined1 local_1c2 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:241:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:241:40)>
  local_1c0;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_1b0;
  StringPtr local_1a0;
  StringPtr local_190;
  StringPtr local_180;
  undefined1 local_16a [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:236:48),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:236:48)>
  local_168;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_158;
  OptionName local_148 [2];
  StringPtr local_128;
  undefined1 local_112 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:231:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:231:40)>
  local_110;
  Function<kj::MainBuilder::Validity_()> local_100;
  OptionName local_f0;
  OptionName local_e0 [2];
  StringPtr local_c0;
  undefined1 local_aa [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:228:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:228:33)>
  local_a8;
  Function<kj::MainBuilder::Validity_()> local_98;
  OptionName local_88 [3];
  StringPtr local_58;
  StringPtr local_48;
  StringPtr local_38;
  undefined1 local_28 [8];
  MainBuilder builder;
  CompilerMain *this_local;
  
  in_RSI->compileEagerness = 1;
  in_RSI->annotationFlag = DROP_ANNOTATIONS;
  context = in_RSI->context;
  kj::StringPtr::StringPtr(&local_38,"Cap\'n Proto version 2.0-dev");
  kj::StringPtr::StringPtr
            (&local_48,
             "Encodes one or more textual Cap\'n Proto messages to binary.  The messages have root type <type> defined in <schema-file>.  Messages are read from standard input.  Each message is a parenthesized struct literal, like the format used to specify constants and default values of struct type in the schema language.  For example:\n    (foo = 123, bar = \"hello\", baz = [true, false, true])\nThe input may contain any number of such values; each will be encoded as a separate message."
            );
  kj::StringPtr::StringPtr
            (&local_58,
             "Note that the current implementation reads the entire input into memory before beginning to encode.  A better implementation would read and encode one message at a time."
            );
  version.content.size_ = local_38.content.size_;
  version.content.ptr = local_38.content.ptr;
  briefDescription.content.size_ = local_48.content.size_;
  briefDescription.content.ptr = local_48.content.ptr;
  extendedDescription.content.size_ = local_58.content.size_;
  extendedDescription.content.ptr = local_58.content.ptr;
  kj::MainBuilder::MainBuilder
            ((MainBuilder *)local_28,context,version,briefDescription,extendedDescription);
  addGlobalOptions(in_RSI,(MainBuilder *)local_28);
  kj::MainBuilder::OptionName::OptionName(local_88,"flat");
  local_88[1]._0_8_ = local_88;
  local_88[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x1;
  local_a8.t = (CompilerMain *)
               kj::_::
               boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_2_>
                         ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:228:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:228:33)>
                           *)in_RSI,(_ *)(local_aa + 1),(CompilerMain *)local_aa,
                          (Type *)local_38.content.size_,(Type *)local_48.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_98,&local_a8);
  kj::StringPtr::StringPtr
            (&local_c0,
             "Expect only one input value, serializing it as a single-segment message with no framing."
            );
  names_01._M_len = (size_type)local_88[1].field_1;
  names_01._M_array = (iterator)local_88[1]._0_8_;
  helpText_01.content.size_ = local_c0.content.size_;
  helpText_01.content.ptr = local_c0.content.ptr;
  func = (Type *)&local_98;
  pMVar1 = kj::MainBuilder::addOption
                     ((MainBuilder *)local_28,names_01,
                      (Function<kj::MainBuilder::Validity_()> *)func,helpText_01);
  kj::MainBuilder::OptionName::OptionName(&local_f0,'p');
  kj::MainBuilder::OptionName::OptionName(local_e0,"packed");
  local_e0[1]._0_8_ = &local_f0;
  local_e0[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x2;
  local_110.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_4_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:231:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:231:40)>
                            *)in_RSI,(_ *)(local_112 + 1),(CompilerMain *)local_112,func,
                           (Type *)local_c0.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_100,&local_110);
  kj::StringPtr::StringPtr
            (&local_128,
             "Pack the output message with standard Cap\'n Proto packing, which deflates zero-valued bytes.  (This writes messages using capnp::writePackedMessage() from <capnp/serialize-packed.h>.  Without this, capnp::writeMessage() from <capnp/serialize.h> is used.)"
            );
  names_00._M_len = (size_type)local_e0[1].field_1;
  names_00._M_array = (iterator)local_e0[1]._0_8_;
  helpText_00.content.size_ = local_128.content.size_;
  helpText_00.content.ptr = local_128.content.ptr;
  func_00 = (Type *)&local_100;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_00,(Function<kj::MainBuilder::Validity_()> *)func_00,helpText_00)
  ;
  kj::MainBuilder::OptionName::OptionName(local_148,"segment-size");
  local_148[1]._0_8_ = local_148;
  local_148[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x1;
  local_168.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_6_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:236:48),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:236:48)>
                            *)in_RSI,(_ *)(local_16a + 1),(CompilerMain *)local_16a,func_00,
                           (Type *)local_128.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_6_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_158,&local_168);
  kj::StringPtr::StringPtr(&local_180,"<n>");
  kj::StringPtr::StringPtr
            (&local_190,
             "Sets the preferred segment size on the MallocMessageBuilder to <n> words and turns off heuristic growth.  This flag is mainly useful for testing.  Without it, each message will be written as a single segment."
            );
  names._M_len = (size_type)local_148[1].field_1;
  names._M_array = (iterator)local_148[1]._0_8_;
  argumentTitle.content.size_ = local_180.content.size_;
  argumentTitle.content.ptr = local_180.content.ptr;
  func_01 = (Type *)&local_158;
  helpText.content.size_ = local_190.content.size_;
  helpText.content.ptr = local_190.content.ptr;
  pMVar1 = kj::MainBuilder::addOptionWithArg
                     (pMVar1,names,(Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func_01,
                      argumentTitle,helpText);
  kj::StringPtr::StringPtr(&local_1a0,"<schema-file>");
  local_1c0.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_8_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:241:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:241:40)>
                            *)in_RSI,(_ *)(local_1c2 + 1),(CompilerMain *)local_1c2,func_01,
                           (Type *)local_180.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_8_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_1b0,&local_1c0);
  func_02 = (Type *)&local_1b0;
  pMVar1 = kj::MainBuilder::expectArg
                     (pMVar1,local_1a0,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func_02);
  kj::StringPtr::StringPtr(&local_1d8,"<type>");
  local_1f8.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_10_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:242:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:242:33)>
                            *)in_RSI,(_ *)(local_1fa + 1),(CompilerMain *)local_1fa,func_02,
                           (Type *)local_180.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_10_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_1e8,&local_1f8);
  func_03 = (Type *)&local_1e8;
  pMVar1 = kj::MainBuilder::expectArg
                     (pMVar1,local_1d8,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func_03);
  local_220.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_12_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:243:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:243:30)>
                            *)in_RSI,(_ *)(local_222 + 1),(CompilerMain *)local_222,func_03,
                           (Type *)local_180.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getEncodeMain()::_lambda(auto:1&,(auto:2&&)___)_12_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_210,&local_220);
  kj::MainBuilder::callAfterParsing(pMVar1,&local_210);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_210);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_1e8);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_1b0);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_158);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_100);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_98);
  kj::MainBuilder::build((MainBuilder *)this);
  kj::MainBuilder::~MainBuilder((MainBuilder *)local_28);
  MVar2.impl.ptr = extraout_RDX;
  MVar2.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar2.impl;
}

Assistant:

kj::MainFunc getEncodeMain() {
    // Only parse the schemas we actually need for decoding.
    compileEagerness = Compiler::NODE;

    // Drop annotations since we don't need them.  This avoids importing files like c++.capnp.
    annotationFlag = Compiler::DROP_ANNOTATIONS;

    kj::MainBuilder builder(context, VERSION_STRING,
          "Encodes one or more textual Cap'n Proto messages to binary.  The messages have root "
          "type <type> defined in <schema-file>.  Messages are read from standard input.  Each "
          "message is a parenthesized struct literal, like the format used to specify constants "
          "and default values of struct type in the schema language.  For example:\n"
          "    (foo = 123, bar = \"hello\", baz = [true, false, true])\n"
          "The input may contain any number of such values; each will be encoded as a separate "
          "message.",

          "Note that the current implementation reads the entire input into memory before "
          "beginning to encode.  A better implementation would read and encode one message at "
          "a time.");
    addGlobalOptions(builder);
    builder.addOption({"flat"}, KJ_BIND_METHOD(*this, codeFlat),
                      "Expect only one input value, serializing it as a single-segment message "
                      "with no framing.")
           .addOption({'p', "packed"}, KJ_BIND_METHOD(*this, codePacked),
                      "Pack the output message with standard Cap'n Proto packing, which "
                      "deflates zero-valued bytes.  (This writes messages using "
                      "capnp::writePackedMessage() from <capnp/serialize-packed.h>.  Without "
                      "this, capnp::writeMessage() from <capnp/serialize.h> is used.)")
           .addOptionWithArg({"segment-size"}, KJ_BIND_METHOD(*this, setSegmentSize), "<n>",
                             "Sets the preferred segment size on the MallocMessageBuilder to <n> "
                             "words and turns off heuristic growth.  This flag is mainly useful "
                             "for testing.  Without it, each message will be written as a single "
                             "segment.")
           .expectArg("<schema-file>", KJ_BIND_METHOD(*this, addSource))
           .expectArg("<type>", KJ_BIND_METHOD(*this, setRootType))
           .callAfterParsing(KJ_BIND_METHOD(*this, encode));
    return builder.build();
  }